

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QString * QRegularExpression::anchoredPattern(QStringView expression)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_e0;
  QStringBuilder<QString,_QLatin1String> local_c8;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&> local_a0;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>,_QLatin1String>
  local_70;
  QStringView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.a.d.d = (Data *)0x0;
  local_e0.d = (Data *)0x0;
  local_e0.ptr = (char16_t *)0x0;
  local_e0.size = 0;
  local_c8.a.d.ptr = (char16_t *)0x0;
  local_c8.a.d.size = 0;
  local_c8.b.m_size = 5;
  local_c8.b.m_data = "\\A(?:";
  QStringBuilder<QString,_QLatin1String>::QStringBuilder(&local_a0.a,&local_c8);
  local_a0.b = &local_30;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>::QStringBuilder
            (&local_70.a,&local_a0);
  local_70.b.m_size = 3;
  local_70.b.m_data = ")\\z";
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>,_QLatin1String>
  ::convertTo<QString>(in_RDI,&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QRegularExpression::anchoredPattern(QStringView expression)
{
    return QString()
           + "\\A(?:"_L1
           + expression
           + ")\\z"_L1;
}